

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::CopyingInputStreamAdaptor
          (CopyingInputStreamAdaptor *this,CopyingInputStream *copying_stream,int block_size)

{
  int local_34;
  int block_size_local;
  CopyingInputStream *copying_stream_local;
  CopyingInputStreamAdaptor *this_local;
  
  ZeroCopyInputStream::ZeroCopyInputStream(&this->super_ZeroCopyInputStream);
  (this->super_ZeroCopyInputStream)._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__CopyingInputStreamAdaptor_0039d140;
  this->copying_stream_ = copying_stream;
  this->owns_copying_stream_ = false;
  this->failed_ = false;
  this->position_ = 0;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&this->buffer_);
  local_34 = block_size;
  if (block_size < 1) {
    local_34 = 0x2000;
  }
  this->buffer_size_ = local_34;
  this->buffer_used_ = 0;
  this->backup_bytes_ = 0;
  return;
}

Assistant:

CopyingInputStreamAdaptor::CopyingInputStreamAdaptor(
    CopyingInputStream* copying_stream, int block_size)
    : copying_stream_(copying_stream),
      owns_copying_stream_(false),
      failed_(false),
      position_(0),
      buffer_size_(block_size > 0 ? block_size : kDefaultBlockSize),
      buffer_used_(0),
      backup_bytes_(0) {}